

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O2

void __thiscall
DIS::StandardVariableSpecification::marshal
          (StandardVariableSpecification *this,DataStream *dataStream)

{
  pointer pSVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  SimulationManagementPduHeader x;
  
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             (((long)(this->_standardVariables).
                     super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_standardVariables).
                    super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x60));
  lVar4 = 0x58;
  uVar3 = 0;
  while( true ) {
    pSVar1 = (this->_standardVariables).
             super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_standardVariables).
                       super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x60) <= uVar3)
    break;
    x._vptr_SimulationManagementPduHeader =
         (_func_int **)&PTR__SimulationManagementPduHeader_001c3098;
    x._pduHeader._vptr_PduHeader = (_func_int **)&PTR__PduHeader_001c27b0;
    uVar2 = *(undefined8 *)((long)pSVar1 + lVar4 + -0x48);
    x._pduHeader._16_5_ = SUB85((ulong)*(undefined8 *)((long)pSVar1 + lVar4 + -0x43) >> 0x18,0);
    x._pduHeader._8_5_ = SUB85(uVar2,0);
    x._pduHeader._timestamp._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    x._originatingID._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
    x._originatingID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    x._originatingID._simulationAddress._8_4_ = *(undefined4 *)((long)pSVar1 + lVar4 + -0x28);
    x._originatingID._entityNumber = *(unsigned_short *)((long)pSVar1 + lVar4 + -0x20);
    x._recevingID._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
    x._recevingID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    x._recevingID._simulationAddress._8_4_ = *(undefined4 *)((long)pSVar1 + lVar4 + -8);
    x._recevingID._entityNumber =
         *(unsigned_short *)((long)&pSVar1->_vptr_SimulationManagementPduHeader + lVar4);
    SimulationManagementPduHeader::marshal(&x,dataStream);
    SimulationManagementPduHeader::~SimulationManagementPduHeader(&x);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x60;
  }
  return;
}

Assistant:

void StandardVariableSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned short )_standardVariables.size();

     for(size_t idx = 0; idx < _standardVariables.size(); idx++)
     {
        SimulationManagementPduHeader x = _standardVariables[idx];
        x.marshal(dataStream);
     }

}